

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Impl::requireStructSize
          (Impl *this,uint64_t id,uint dataWordCount,uint pointerCount)

{
  HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize> *table;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> **ppRVar1;
  ushort uVar2;
  Entry *pEVar3;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *pRVar4;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *pRVar5;
  uint16_t uVar6;
  size_t newSize;
  Entry local_48;
  Impl<0UL,_false> local_38;
  undefined7 uStack_37;
  long local_30;
  
  table = &this->structSizeRequirements;
  local_48.value.dataWordCount = (uint16_t)dataWordCount;
  local_48.value.pointerCount = (uint16_t)pointerCount;
  local_48.key = id;
  kj::
  Table<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            (&local_38,&table->table,
             (long)(this->structSizeRequirements).table.rows.builder.pos -
             (long)(this->structSizeRequirements).table.rows.builder.ptr >> 4,&local_48,0xffffffff);
  if (local_38 == (Impl<0UL,_false>)0x1) {
    pEVar3 = (table->table).rows.builder.ptr;
    uVar2 = pEVar3[local_30].value.dataWordCount;
    uVar6 = local_48.value.dataWordCount;
    if (local_48.value.dataWordCount < uVar2) {
      uVar6 = uVar2;
    }
    pEVar3[local_30].value.dataWordCount = uVar6;
    uVar2 = pEVar3[local_30].value.pointerCount;
    uVar6 = local_48.value.pointerCount;
    if (local_48.value.pointerCount < uVar2) {
      uVar6 = uVar2;
    }
    pEVar3[local_30].value.pointerCount = uVar6;
  }
  else {
    pRVar5 = (this->structSizeRequirements).table.rows.builder.pos;
    if (pRVar5 == (this->structSizeRequirements).table.rows.builder.endPtr) {
      pRVar4 = (this->structSizeRequirements).table.rows.builder.ptr;
      newSize = 4;
      if (pRVar5 != pRVar4) {
        newSize = (long)pRVar5 - (long)pRVar4 >> 3;
      }
      kj::Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>::
      setCapacity((Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                   *)table,newSize);
      pRVar5 = (this->structSizeRequirements).table.rows.builder.pos;
    }
    pRVar5->key = local_48.key;
    *(ulong *)&pRVar5->value =
         CONCAT44(local_48._12_4_,CONCAT22(local_48.value.pointerCount,local_48.value.dataWordCount)
                 );
    ppRVar1 = &(this->structSizeRequirements).table.rows.builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&local_38,(unsigned_long *)&this->schemas);
  if (CONCAT71(uStack_37,local_38) != 0) {
    applyStructSizeRequirement
              (this,*(RawSchema **)(CONCAT71(uStack_37,local_38) + 8),dataWordCount,pointerCount);
  }
  return;
}

Assistant:

void SchemaLoader::Impl::requireStructSize(uint64_t id, uint dataWordCount, uint pointerCount) {
  structSizeRequirements.upsert(id, { uint16_t(dataWordCount), uint16_t(pointerCount) },
      [&](RequiredSize& existingValue, RequiredSize&& newValue) {
    existingValue.dataWordCount = kj::max(existingValue.dataWordCount, newValue.dataWordCount);
    existingValue.pointerCount = kj::max(existingValue.pointerCount, newValue.pointerCount);
  });

  KJ_IF_SOME(schema, schemas.find(id)) {
    applyStructSizeRequirement(schema, dataWordCount, pointerCount);
  }
}